

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_mask_pred_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10ab78d::AV1HighbdCompAvgPredTest_CheckOutput_Test::TestBody
          (AV1HighbdCompAvgPredTest_CheckOutput_Test *this)

{
  BLOCK_SIZE_conflict in_stack_00000047;
  highbd_comp_avg_pred_func in_stack_00000048;
  AV1HighbdCompAvgPredTest *in_stack_00000050;
  
  testing::
  WithParamInterface<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>_>
  ::GetParam();
  std::
  get<0ul,void(*)(unsigned_char*,unsigned_char_const*,int,int,unsigned_char_const*,int),BLOCK_SIZE,int>
            ((tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>
              *)0xab76cf);
  testing::
  WithParamInterface<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>_>
  ::GetParam();
  std::
  get<1ul,void(*)(unsigned_char*,unsigned_char_const*,int,int,unsigned_char_const*,int),BLOCK_SIZE,int>
            ((tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>
              *)0xab76e4);
  AV1HighbdCompAvgPredTest::RunCheckOutput(in_stack_00000050,in_stack_00000048,in_stack_00000047);
  return;
}

Assistant:

TEST_P(AV1HighbdCompAvgPredTest, CheckOutput) {
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1));
}